

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.cpp
# Opt level: O1

void __thiscall
basisu::image_metrics::calc
          (image_metrics *this,image *a,image *b,uint32_t first_chan,uint32_t total_chans,
          bool avg_comp_error,bool use_601_luma)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  color_rgba *pcVar6;
  color_rgba *pcVar7;
  uint uVar8;
  uint uVar9;
  byte bVar10;
  uint32_t i;
  uint uVar11;
  uint32_t uVar12;
  long lVar13;
  uint uVar14;
  uint32_t uVar15;
  ulong uVar16;
  byte bVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  uint8_t *puVar21;
  ulong uVar22;
  uint8_t *puVar23;
  uint uVar24;
  float fVar27;
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar28 [16];
  double dVar29;
  float fVar30;
  double dVar31;
  double hist [256];
  uint local_8c8;
  ulong local_8b0;
  double local_838 [257];
  
  if ((3 < first_chan) || (4 < first_chan + total_chans)) {
    __assert_fail("(first_chan < 4U) && (first_chan + total_chans <= 4U)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_enc.cpp"
                  ,0x56b,
                  "void basisu::image_metrics::calc(const image &, const image &, uint32_t, uint32_t, bool, bool)"
                 );
  }
  uVar1 = b->m_width;
  uVar2 = b->m_height;
  uVar3 = a->m_height;
  uVar8 = a->m_width;
  if (uVar1 <= a->m_width) {
    uVar8 = uVar1;
  }
  uVar9 = uVar2;
  if (uVar3 < uVar2) {
    uVar9 = uVar3;
  }
  local_8b0 = 0;
  memset(local_838,0,0x800);
  if (uVar9 != 0) {
    uVar12 = a->m_pitch;
    uVar4 = (a->m_pixels).m_size;
    pcVar6 = (a->m_pixels).m_p;
    uVar15 = b->m_pitch;
    uVar5 = (b->m_pixels).m_size;
    pcVar7 = (b->m_pixels).m_p;
    iVar18 = 0x3672;
    if (use_601_luma) {
      iVar18 = 0x4c8b;
    }
    iVar19 = 0xb715;
    if (use_601_luma) {
      iVar19 = 0x9646;
    }
    iVar20 = 0x1279;
    if (use_601_luma) {
      iVar20 = 0x1d2f;
    }
    local_8c8 = 0;
    uVar11 = 0;
    do {
      if (uVar8 != 0) {
        if (uVar3 <= uVar11) {
LAB_00228ed0:
          __assert_fail("x < m_width && y < m_height",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_enc.h"
                        ,0xb00,
                        "const color_rgba &basisu::image::operator()(uint32_t, uint32_t) const");
        }
        puVar21 = pcVar6[local_8c8].field_0.m_comps + first_chan;
        puVar23 = pcVar7[local_8b0].field_0.m_comps + first_chan;
        uVar22 = 0;
        do {
          uVar14 = uVar12 * uVar11 + (int)uVar22;
          if (uVar4 <= uVar14) {
LAB_00228eb1:
            __assert_fail("i < m_size",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                          ,0x177,
                          "const T &basisu::vector<basisu::color_rgba>::operator[](size_t) const [T = basisu::color_rgba]"
                         );
          }
          if ((uVar2 <= uVar11) || (uVar1 <= uVar22)) goto LAB_00228ed0;
          uVar24 = uVar15 * uVar11 + (int)uVar22;
          if (uVar5 <= uVar24) goto LAB_00228eb1;
          if (total_chans == 0) {
            uVar24 = ((uint)pcVar6[uVar14].field_0.m_comps[2] * iVar20 + 0x8000 +
                      (uint)pcVar6[uVar14].field_0.m_comps[1] * iVar19 +
                      (uint)pcVar6[uVar14].field_0.m_comps[0] * iVar18 >> 0x10) -
                     ((uint)pcVar7[uVar24].field_0.m_comps[2] * iVar20 + 0x8000 +
                      (uint)pcVar7[uVar24].field_0.m_comps[1] * iVar19 +
                      (uint)pcVar7[uVar24].field_0.m_comps[0] * iVar18 >> 0x10);
            uVar14 = -uVar24;
            if (0 < (int)uVar24) {
              uVar14 = uVar24;
            }
            local_838[uVar14] = local_838[uVar14] + 1.0;
          }
          else {
            uVar16 = 0;
            do {
              if (4 - first_chan == uVar16) {
                __assert_fail("index < 4",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_enc.h"
                              ,0x374,"const uint8_t &basisu::color_rgba::operator[](uint32_t) const"
                             );
              }
              bVar10 = (byte)((uint)puVar21[uVar16] - (uint)puVar23[uVar16]);
              bVar17 = -bVar10;
              if (0 < (int)((uint)puVar21[uVar16] - (uint)puVar23[uVar16])) {
                bVar17 = bVar10;
              }
              local_838[bVar17] = local_838[bVar17] + 1.0;
              uVar16 = uVar16 + 1;
            } while (total_chans != uVar16);
          }
          uVar22 = uVar22 + 1;
          puVar21 = puVar21 + 4;
          puVar23 = puVar23 + 4;
        } while (uVar22 != uVar8);
      }
      uVar11 = uVar11 + 1;
      local_8c8 = local_8c8 + uVar12;
      local_8b0 = (ulong)((int)local_8b0 + uVar15);
    } while (uVar11 != uVar9);
  }
  this->m_max = 0.0;
  auVar26 = ZEXT816(0);
  fVar27 = 0.0;
  lVar13 = 0;
  do {
    dVar29 = local_838[lVar13];
    if ((dVar29 != 0.0) || (NAN(dVar29))) {
      fVar30 = (float)(int)lVar13;
      if (fVar27 <= fVar30) {
        fVar27 = fVar30;
      }
      this->m_max = fVar27;
      dVar31 = (double)(int)lVar13;
      dVar29 = dVar29 * dVar31;
      dVar25 = auVar26._8_8_;
      auVar26._0_8_ = auVar26._0_8_ + dVar29;
      auVar26._8_8_ = dVar25 + dVar31 * dVar29;
    }
    lVar13 = lVar13 + 1;
  } while (lVar13 != 0x100);
  dVar29 = (double)uVar9 * (double)uVar8;
  if (avg_comp_error) {
    uVar12 = 4;
    if (total_chans < 4) {
      uVar12 = total_chans;
    }
    uVar15 = 1;
    if (total_chans != 0) {
      uVar15 = uVar12;
    }
    dVar29 = dVar29 * (double)(int)uVar15;
  }
  auVar28._8_4_ = SUB84(dVar29,0);
  auVar28._0_8_ = dVar29;
  auVar28._12_4_ = (int)((ulong)dVar29 >> 0x20);
  auVar26 = divpd(auVar26,auVar28);
  auVar28 = minpd(_DAT_003212c0,auVar26);
  fVar27 = (float)(double)(-(ulong)(0.0 <= auVar26._8_8_) & auVar28._8_8_);
  this->m_mean = (float)(double)(-(ulong)(0.0 <= auVar26._0_8_) & auVar28._0_8_);
  this->m_mean_squared = fVar27;
  if (fVar27 < 0.0) {
    fVar27 = sqrtf(fVar27);
  }
  else {
    fVar27 = SQRT(fVar27);
  }
  this->m_rms = fVar27;
  if ((fVar27 != 0.0) || (NAN(fVar27))) {
    dVar25 = log10(255.0 / (double)fVar27);
    dVar25 = dVar25 * 20.0;
    dVar29 = 100.0;
    if (dVar25 <= 100.0) {
      dVar29 = dVar25;
    }
    fVar27 = (float)(double)(~-(ulong)(dVar25 < 0.0) & (ulong)dVar29);
  }
  else {
    fVar27 = 100.0;
  }
  this->m_psnr = fVar27;
  return;
}

Assistant:

void image_metrics::calc(const image &a, const image &b, uint32_t first_chan, uint32_t total_chans, bool avg_comp_error, bool use_601_luma)
	{
		assert((first_chan < 4U) && (first_chan + total_chans <= 4U));

		const uint32_t width = basisu::minimum(a.get_width(), b.get_width());
		const uint32_t height = basisu::minimum(a.get_height(), b.get_height());

		double hist[256];
		clear_obj(hist);

		for (uint32_t y = 0; y < height; y++)
		{
			for (uint32_t x = 0; x < width; x++)
			{
				const color_rgba &ca = a(x, y), &cb = b(x, y);

				if (total_chans)
				{
					for (uint32_t c = 0; c < total_chans; c++)
						hist[iabs(ca[first_chan + c] - cb[first_chan + c])]++;
				}
				else
				{
					if (use_601_luma)
						hist[iabs(ca.get_601_luma() - cb.get_601_luma())]++;
					else
						hist[iabs(ca.get_709_luma() - cb.get_709_luma())]++;
				}
			}
		}

		m_max = 0;
		double sum = 0.0f, sum2 = 0.0f;
		for (uint32_t i = 0; i < 256; i++)
		{
			if (hist[i])
			{
				m_max = basisu::maximum<float>(m_max, (float)i);
				double v = i * hist[i];
				sum += v;
				sum2 += i * v;
			}
		}

		double total_values = (double)width * (double)height;
		if (avg_comp_error)
			total_values *= (double)clamp<uint32_t>(total_chans, 1, 4);

		m_mean = (float)clamp<double>(sum / total_values, 0.0f, 255.0);
		m_mean_squared = (float)clamp<double>(sum2 / total_values, 0.0f, 255.0f * 255.0f);
		m_rms = (float)sqrt(m_mean_squared);
		m_psnr = m_rms ? (float)clamp<double>(log10(255.0 / m_rms) * 20.0f, 0.0f, 100.0f) : 100.0f;
	}